

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O3

void __thiscall CServerBrowser::SaveServerlist(CServerBrowser *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  long in_FS_OFFSET;
  CJsonWriter Writer;
  CJsonWriter local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                    (this->m_pStorage,"serverlist.json",2,0,0,0,0,0);
  if ((IOHANDLE)CONCAT44(extraout_var,iVar1) != (IOHANDLE)0x0) {
    CJsonWriter::CJsonWriter(&local_58,(IOHANDLE)CONCAT44(extraout_var,iVar1));
    CJsonWriter::BeginObject(&local_58);
    CJsonWriter::WriteAttribute(&local_58,"serverlist");
    CJsonWriter::BeginArray(&local_58);
    if (0 < this->m_aServerlist[0].m_NumServers) {
      lVar2 = 0;
      do {
        CJsonWriter::WriteStrValue
                  (&local_58,(this->m_aServerlist[0].m_ppServerlist[lVar2]->m_Info).m_aAddress);
        lVar2 = lVar2 + 1;
      } while (lVar2 < this->m_aServerlist[0].m_NumServers);
    }
    CJsonWriter::EndArray(&local_58);
    CJsonWriter::EndObject(&local_58);
    CJsonWriter::~CJsonWriter(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowser::SaveServerlist()
{
	IOHANDLE File = Storage()->OpenFile(s_pFilename, IOFLAG_WRITE, IStorage::TYPE_SAVE);
	if(!File)
		return;

	CJsonWriter Writer(File);
	Writer.BeginObject(); // root
	Writer.WriteAttribute("serverlist");
	Writer.BeginArray();
	for(int i = 0; i < m_aServerlist[IServerBrowser::TYPE_INTERNET].m_NumServers; ++i)
		Writer.WriteStrValue(m_aServerlist[IServerBrowser::TYPE_INTERNET].m_ppServerlist[i]->m_Info.m_aAddress);
	Writer.EndArray();
	Writer.EndObject();
}